

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::removedVecs(SPxSteepPR<double> *this,int *perm)

{
  Type TVar1;
  int iVar2;
  double *pdVar3;
  long in_RSI;
  long in_RDI;
  VectorBase<double> *unaff_retaddr;
  int j;
  int i;
  VectorBase<double> *weights;
  undefined8 in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  TVar1 = SPxSolverBase<double>::type(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  if (TVar1 == ENTER) {
    iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x2ad030);
    for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
      if (-1 < *(int *)(in_RSI + (long)local_1c * 4)) {
        pdVar3 = VectorBase<double>::operator[]
                           (in_stack_ffffffffffffffd0,
                            (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        in_stack_ffffffffffffffd0 = (VectorBase<double> *)*pdVar3;
        pdVar3 = VectorBase<double>::operator[]
                           (in_stack_ffffffffffffffd0,
                            (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        *pdVar3 = (double)in_stack_ffffffffffffffd0;
      }
    }
  }
  SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2ad0b7);
  VectorBase<double>::reDim
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  return;
}

Assistant:

void SPxSteepPR<R>::removedVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;

   if(this->thesolver->type() == SPxSolverBase<R>::ENTER)
   {
      int i;
      int j = weights.dim();

      for(i = 0; i < j; ++i)
      {
         if(perm[i] >= 0)
            weights[perm[i]] = weights[i];
      }
   }

   weights.reDim(this->thesolver->coDim());
}